

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io-util.cc
# Opt level: O0

string * tinyusdz::io::GetFileExtension(string *__return_storage_ptr__,string *FileName)

{
  string *psVar1;
  long lVar2;
  allocator local_19;
  string *local_18;
  string *FileName_local;
  
  local_18 = FileName;
  FileName_local = __return_storage_ptr__;
  lVar2 = std::__cxx11::string::find_last_of((char *)FileName,0x3ab613);
  psVar1 = local_18;
  if (lVar2 == -1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_19);
    std::allocator<char>::~allocator((allocator<char> *)&local_19);
  }
  else {
    std::__cxx11::string::find_last_of((char *)local_18,0x3ab613);
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)psVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GetFileExtension(const std::string &FileName) {
  if (FileName.find_last_of(".") != std::string::npos)
    return FileName.substr(FileName.find_last_of(".") + 1);
  return "";
}